

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransformationData.cpp
# Opt level: O2

void __thiscall TransformationData::rollback(TransformationData *this)

{
  vector<Quad_*,_std::allocator<Quad_*>_> *pvVar1;
  Vec2d *this_00;
  
  Quad::deleteQuads(this->workingQuads,true);
  operator_delete(this->workingOffset);
  pvVar1 = Quad::cloneQuads(this->previousQuads);
  this->workingQuads = pvVar1;
  this->workingRotation = this->previousRotation;
  this_00 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(this_00,this->previousOffset);
  this->workingOffset = this_00;
  return;
}

Assistant:

void TransformationData::rollback() {
    Quad::deleteQuads(workingQuads, true);
    delete workingOffset;
    
    workingQuads = Quad::cloneQuads(previousQuads);
    workingRotation = previousRotation;
    workingOffset = new Vec2d(previousOffset);
}